

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_manager.cpp
# Opt level: O0

void __thiscall cfdcore_manager_Finalize_Test::TestBody(cfdcore_manager_Finalize_Test *this)

{
  bool bVar1;
  AssertHelper local_38;
  Message local_30 [3];
  void *local_18;
  CfdCoreHandle handle;
  cfdcore_manager_Finalize_Test *this_local;
  
  local_18 = (void *)0x0;
  handle = this;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Finalize(local_18,false);
    }
  }
  else {
    testing::Message::Message(local_30);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_manager.cpp"
               ,0x31,
               "Expected: (Finalize(handle)) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_38,local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::Message::~Message(local_30);
  }
  return;
}

Assistant:

TEST(cfdcore_manager, Finalize) {
  // error only
  CfdCoreHandle handle = nullptr;
  EXPECT_NO_THROW((Finalize(handle)));
}